

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O3

void http_on_request_handler______internal(http_s *h,http_settings_s *settings)

{
  int *piVar1;
  FIOBJ hash;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  FIOBJ FVar5;
  FIOBJ FVar6;
  fiobj_object_vtable_s *pfVar7;
  size_t sVar8;
  uintptr_t uVar9;
  char *pcVar10;
  char cVar11;
  fio_str_info_s val;
  fio_str_info_s local_48;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fio_siphash13("upgrade",7,0x1456f2,0x145bc9);
  }
  h->udata = settings->udata;
  if (http_on_request_handler______internal::host_hash == 0) {
    http_on_request_handler______internal::host_hash = fio_siphash13("host",4,0x1456f2,0x145bc9);
  }
  FVar5 = fiobj_hash_get2(h->headers,http_on_request_handler______internal::host_hash);
  FVar6 = HTTP_HEADER_HOST;
  if (FVar5 == 0) {
    if (4 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http_internal.c:72): missing Host header"
                    );
    }
    http_send_error(h,400);
    return;
  }
  if (((~(uint)FVar5 & 6) != 0 && (FVar5 & 1) == 0) &&
     (*(char *)(FVar5 & 0xfffffffffffffff8) == ')')) {
    hash = h->headers;
    FVar5 = fiobj_ary_pop(FVar5);
    fiobj_hash_set(hash,FVar6,FVar5);
  }
  FVar6 = fiobj_hash_get2(h->headers,http_upgrade_hash);
  if (FVar6 == 0) {
    FVar6 = h->headers;
    if (((uint)HTTP_HEADER_ACCEPT & 7) == 2) {
      FVar5 = fiobj_str_hash(HTTP_HEADER_ACCEPT);
    }
    else {
      uVar3 = (uint)HTTP_HEADER_ACCEPT & 6;
      FVar5 = HTTP_HEADER_ACCEPT;
      if (((uVar3 != 6) && (HTTP_HEADER_ACCEPT != 0)) && ((HTTP_HEADER_ACCEPT & 1) == 0)) {
        if ((HTTP_HEADER_ACCEPT & 6) == 0) {
          switch(*(undefined1 *)(HTTP_HEADER_ACCEPT & 0xfffffffffffffff8)) {
          case 0x27:
            pfVar7 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case 0x28:
            goto switchD_00152651_caseD_28;
          case 0x29:
            pfVar7 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case 0x2a:
            goto switchD_00152651_caseD_2a;
          case 0x2b:
            pfVar7 = &FIOBJECT_VTABLE_DATA;
            break;
          default:
            pfVar7 = &FIOBJECT_VTABLE_NUMBER;
          }
        }
        else if (uVar3 == 2) {
switchD_00152651_caseD_28:
          pfVar7 = &FIOBJECT_VTABLE_STRING;
        }
        else {
switchD_00152651_caseD_2a:
          pfVar7 = &FIOBJECT_VTABLE_HASH;
        }
        (*pfVar7->to_str)(&local_48,HTTP_HEADER_ACCEPT);
        FVar5 = fio_siphash13(local_48.data,CONCAT44(local_48.len._4_4_,(undefined4)local_48.len),
                              0x1456f2,0x145bc9);
      }
    }
    FVar5 = fiobj_hash_get2(FVar6,FVar5);
    FVar6 = HTTP_HVALUE_SSE_MIME;
    if (FVar5 == HTTP_HVALUE_SSE_MIME) goto LAB_001526a0;
    if ((HTTP_HVALUE_SSE_MIME != 0 && FVar5 != 0) && ((~(uint)HTTP_HVALUE_SSE_MIME & 6) != 0)) {
      uVar3 = (uint)FVar5 & 6;
      if ((uVar3 != 6) && ((((uint)HTTP_HVALUE_SSE_MIME | (uint)FVar5) & 1) == 0)) {
        pcVar10 = (char *)(FVar5 & 0xfffffffffffffff8);
        if (*pcVar10 == *(char *)(HTTP_HVALUE_SSE_MIME & 0xfffffffffffffff8)) {
          if ((FVar5 & 6) == 0) {
            switch(*pcVar10) {
            case '\'':
              pfVar7 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_001527a0_caseD_28;
            case ')':
              pfVar7 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_001527a0_caseD_2a;
            case '+':
              pfVar7 = &FIOBJECT_VTABLE_DATA;
              break;
            default:
              pfVar7 = &FIOBJECT_VTABLE_NUMBER;
            }
          }
          else if (uVar3 == 2) {
switchD_001527a0_caseD_28:
            pfVar7 = &FIOBJECT_VTABLE_STRING;
          }
          else {
switchD_001527a0_caseD_2a:
            pfVar7 = &FIOBJECT_VTABLE_HASH;
          }
          sVar8 = (*pfVar7->is_eq)(FVar5,HTTP_HVALUE_SSE_MIME);
          if (sVar8 != 0) {
            if ((FVar5 & 6) == 0) {
              switch(*pcVar10) {
              case '\'':
                pfVar7 = &FIOBJECT_VTABLE_FLOAT;
                break;
              case '(':
                goto switchD_0015281a_caseD_28;
              case ')':
                pfVar7 = &FIOBJECT_VTABLE_ARRAY;
                break;
              case '*':
                goto switchD_0015281a_caseD_2a;
              case '+':
                pfVar7 = &FIOBJECT_VTABLE_DATA;
                break;
              default:
                pfVar7 = &FIOBJECT_VTABLE_NUMBER;
              }
            }
            else if (uVar3 == 2) {
switchD_0015281a_caseD_28:
              pfVar7 = &FIOBJECT_VTABLE_STRING;
            }
            else {
switchD_0015281a_caseD_2a:
              pfVar7 = &FIOBJECT_VTABLE_HASH;
            }
            if (pfVar7->each ==
                (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)
            goto LAB_001526a0;
            if ((FVar5 & 6) == 0) {
              switch(*pcVar10) {
              case '\'':
                pfVar7 = &FIOBJECT_VTABLE_FLOAT;
                break;
              case '(':
                goto switchD_00152869_caseD_28;
              case ')':
                pfVar7 = &FIOBJECT_VTABLE_ARRAY;
                break;
              case '*':
                goto switchD_00152869_caseD_2a;
              case '+':
                pfVar7 = &FIOBJECT_VTABLE_DATA;
                break;
              default:
                pfVar7 = &FIOBJECT_VTABLE_NUMBER;
              }
            }
            else if (uVar3 == 2) {
switchD_00152869_caseD_28:
              pfVar7 = &FIOBJECT_VTABLE_STRING;
            }
            else {
switchD_00152869_caseD_2a:
              pfVar7 = &FIOBJECT_VTABLE_HASH;
            }
            uVar9 = (*pfVar7->count)(FVar5);
            if ((uVar9 == 0) || (iVar4 = fiobj_iseq____internal_complex__(FVar5,FVar6), iVar4 != 0))
            {
LAB_001526a0:
              (*settings->on_upgrade)(h,"sse",3);
              return;
            }
          }
        }
      }
    }
    if (settings->public_folder == (char *)0x0) goto LAB_00152971;
    uVar2 = h->path;
    if (uVar2 == 0) {
LAB_0015293c:
      local_48.data = anon_var_dwarf_20c;
      local_48.len._0_4_ = 4;
      goto LAB_0015294f;
    }
    cVar11 = (char)uVar2;
    if ((uVar2 & 1) == 0) {
      switch((uint)uVar2 & 6) {
      case 0:
        cVar11 = *(char *)(uVar2 & 0xfffffffffffffff8);
LAB_001528d9:
        switch(cVar11) {
        case '\'':
          pfVar7 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          goto switchD_001528ce_caseD_2;
        case ')':
          pfVar7 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          goto switchD_001528ce_caseD_4;
        case '+':
          pfVar7 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar7 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_001528ce_caseD_2:
        pfVar7 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_001528ce_caseD_4:
        pfVar7 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if (cVar11 == '&') {
          local_48.data = anon_var_dwarf_217;
          local_48.len._0_4_ = 5;
        }
        else {
          uVar3 = (uint)uVar2 & 0xff;
          if (uVar3 != 0x16) {
            if (uVar3 == 6) goto LAB_0015293c;
            goto LAB_001528d9;
          }
          local_48.data = anon_var_dwarf_222;
          local_48.len._0_4_ = 4;
        }
LAB_0015294f:
        local_48.capa._0_4_ = 0;
        local_48.capa._4_4_ = 0;
        local_48.len._4_4_ = 0;
        goto LAB_00152953;
      }
      (*pfVar7->to_str)(&local_48,uVar2);
    }
    else {
      fio_ltocstr(&local_48,(long)uVar2 >> 1);
    }
LAB_00152953:
    iVar4 = http_sendfile2(h,settings->public_folder,settings->public_folder_length,local_48.data,
                           CONCAT44(local_48.len._4_4_,(undefined4)local_48.len));
    if (iVar4 == 0) {
      return;
    }
LAB_00152971:
    (*settings->on_request)(h);
    return;
  }
  uVar3 = (uint)FVar6 & 6;
  cVar11 = (char)FVar6;
  if (uVar3 == 6 || (FVar6 & 1) != 0) {
    if ((FVar6 & 1) != 0) {
      fio_ltocstr(&local_48,(long)FVar6 >> 1);
      goto LAB_001525ba;
    }
    switch(uVar3) {
    case 0:
      goto switchD_001524ae_caseD_0;
    case 4:
      goto switchD_001524ae_caseD_4;
    case 6:
      goto switchD_001524ae_caseD_6;
    }
switchD_001524ae_caseD_2:
    pfVar7 = &FIOBJECT_VTABLE_STRING;
  }
  else {
    LOCK();
    piVar1 = (int *)((FVar6 & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    switch(uVar3) {
    case 0:
switchD_001524ae_caseD_0:
      cVar11 = *(char *)(FVar6 & 0xfffffffffffffff8);
LAB_00152528:
      switch(cVar11) {
      case '\'':
        pfVar7 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_001524ae_caseD_2;
      case ')':
        pfVar7 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_001524ae_caseD_4;
      case '+':
        pfVar7 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar7 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
      goto switchD_001524ae_caseD_2;
    case 4:
switchD_001524ae_caseD_4:
      pfVar7 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
switchD_001524ae_caseD_6:
      if (cVar11 == '&') {
        local_48.data = anon_var_dwarf_217;
        local_48.len._0_4_ = 5;
      }
      else {
        uVar3 = (uint)FVar6 & 0xff;
        if (uVar3 == 0x16) {
          local_48.data = anon_var_dwarf_222;
          local_48.len._0_4_ = 4;
        }
        else {
          if (uVar3 != 6) goto LAB_00152528;
          local_48.data = anon_var_dwarf_20c;
          local_48.len._0_4_ = 4;
        }
      }
      local_48.len._4_4_ = 0;
      local_48.capa._4_4_ = 0;
      local_48.capa._0_4_ = 0;
      goto LAB_001525ba;
    }
  }
  (*pfVar7->to_str)(&local_48,FVar6);
LAB_001525ba:
  if ((*local_48.data == 'h') && (local_48.data[1] == '2')) {
    http_send_error(h,400);
  }
  else {
    (*settings->on_upgrade)(h,local_48.data,CONCAT44(local_48.len._4_4_,(undefined4)local_48.len));
  }
  fiobj_free(FVar6);
  return;
}

Assistant:

void http_on_request_handler______internal(http_s *h,
                                           http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;

  static uint64_t host_hash = 0;
  if (!host_hash)
    host_hash = fiobj_hash_string("host", 4);

  if (1) {
    /* test for Host header and avoid duplicates */
    FIOBJ tmp = fiobj_hash_get2(h->headers, host_hash);
    if (!tmp)
      goto missing_host;
    if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY)) {
      fiobj_hash_set(h->headers, HTTP_HEADER_HOST, fiobj_ary_pop(tmp));
    }
  }

  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t)
    goto upgrade;

  if (fiobj_iseq(
          fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_ACCEPT)),
          HTTP_HVALUE_SSE_MIME))
    goto eventsource;
  if (settings->public_folder) {
    fio_str_info_s path_str = fiobj_obj2cstr(h->path);
    if (!http_sendfile2(h, settings->public_folder,
                        settings->public_folder_length, path_str.data,
                        path_str.len)) {
      return;
    }
  }
  settings->on_request(h);
  return;

upgrade:
  if (1) {
    fiobj_dup(t); /* allow upgrade name access after http_finish */
    fio_str_info_s val = fiobj_obj2cstr(t);
    if (val.data[0] == 'h' && val.data[1] == '2') {
      http_send_error(h, 400);
    } else {
      settings->on_upgrade(h, val.data, val.len);
    }
    fiobj_free(t);
    return;
  }
eventsource:
  settings->on_upgrade(h, (char *)"sse", 3);
  return;
missing_host:
  FIO_LOG_DEBUG("missing Host header");
  http_send_error(h, 400);
  return;
}